

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Turtlebot.cpp
# Opt level: O3

void __thiscall chrono::turtlebot::TurtleBot::Initialize(TurtleBot *this)

{
  element_type *peVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  ChSystem *pCVar4;
  element_type *peVar5;
  long lVar6;
  element_type *peVar7;
  element_type *peVar8;
  element_type *peVar9;
  element_type *peVar10;
  double *pdVar11;
  long lVar12;
  ChVector<double> *rel_joint_pos;
  ChVector<double> *rel_joint_pos_00;
  shared_ptr<chrono::ChFunction_Const> const_speed_function_r;
  shared_ptr<chrono::ChFunction_Const> const_speed_function_l;
  undefined1 local_4a8 [24];
  double local_490;
  shared_ptr<chrono::ChBodyAuxRef> local_488;
  shared_ptr<chrono::ChBodyAuxRef> local_478;
  shared_ptr<chrono::ChBodyAuxRef> local_468;
  shared_ptr<chrono::ChBodyAuxRef> local_458;
  shared_ptr<chrono::ChBodyAuxRef> local_448;
  shared_ptr<chrono::ChBodyAuxRef> local_438;
  shared_ptr<chrono::ChBodyAuxRef> local_428;
  shared_ptr<chrono::ChBodyAuxRef> local_418;
  shared_ptr<chrono::ChBodyAuxRef> local_408;
  shared_ptr<chrono::ChBodyAuxRef> local_3f8;
  shared_ptr<chrono::ChBodyAuxRef> local_3e8;
  shared_ptr<chrono::ChBodyAuxRef> local_3d8;
  shared_ptr<chrono::ChBodyAuxRef> local_3c8;
  shared_ptr<chrono::ChBodyAuxRef> local_3b8;
  shared_ptr<chrono::ChBodyAuxRef> local_3a8;
  shared_ptr<chrono::ChBodyAuxRef> local_398;
  shared_ptr<chrono::ChBodyAuxRef> local_388;
  shared_ptr<chrono::ChBodyAuxRef> local_378;
  shared_ptr<chrono::ChBodyAuxRef> local_368;
  shared_ptr<chrono::ChBodyAuxRef> local_358;
  shared_ptr<chrono::ChBodyAuxRef> local_348;
  shared_ptr<chrono::ChFunction_Const> local_338;
  shared_ptr<chrono::ChBodyAuxRef> local_328;
  shared_ptr<chrono::ChBodyAuxRef> local_318;
  shared_ptr<chrono::ChBody> local_308;
  shared_ptr<chrono::ChBodyAuxRef> local_2f8;
  shared_ptr<chrono::ChBodyAuxRef> local_2e8;
  shared_ptr<chrono::ChBodyAuxRef> local_2d8;
  shared_ptr<chrono::ChFunction_Const> local_2c8;
  shared_ptr<chrono::ChBodyAuxRef> local_2b8;
  shared_ptr<chrono::ChBodyAuxRef> local_2a8;
  shared_ptr<chrono::ChBody> local_298;
  ChVector<double> v_2;
  ChVector<double> v_1;
  ChVector<double> v;
  ChQuaternion<double> z2x;
  undefined1 local_208 [16];
  double dStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 uStack_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 uStack_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  shared_ptr<chrono::ChLinkMotorRotationSpeed> local_178;
  double adStack_168 [16];
  ChQuaternion<double> z2y;
  ChVector<double> local_c8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 uStack_a0;
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 uStack_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  undefined8 uStack_60;
  undefined8 uStack_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  Turtlebot_Chassis::Initialize
            ((this->m_chassis).
             super___shared_ptr<chrono::turtlebot::Turtlebot_Chassis,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr);
  Turtlebot_BottomPlate::Initialize
            ((this->m_bottom_plate).
             super___shared_ptr<chrono::turtlebot::Turtlebot_BottomPlate,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr);
  Turtlebot_MiddlePlate::Initialize
            ((this->m_middle_plate).
             super___shared_ptr<chrono::turtlebot::Turtlebot_MiddlePlate,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr);
  Turtlebot_TopPlate::Initialize
            ((this->m_top_plate).
             super___shared_ptr<chrono::turtlebot::Turtlebot_TopPlate,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr);
  Turtlebot_ActiveWheel::Initialize
            ((((this->m_drive_wheels).
               super__Vector_base<std::shared_ptr<chrono::turtlebot::Turtlebot_ActiveWheel>,_std::allocator<std::shared_ptr<chrono::turtlebot::Turtlebot_ActiveWheel>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super___shared_ptr<chrono::turtlebot::Turtlebot_ActiveWheel,_(__gnu_cxx::_Lock_policy)2>
             )._M_ptr);
  Turtlebot_PassiveWheel::Initialize
            ((((this->m_passive_wheels).
               super__Vector_base<std::shared_ptr<chrono::turtlebot::Turtlebot_PassiveWheel>,_std::allocator<std::shared_ptr<chrono::turtlebot::Turtlebot_PassiveWheel>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super___shared_ptr<chrono::turtlebot::Turtlebot_PassiveWheel,_(__gnu_cxx::_Lock_policy)2>
             )._M_ptr);
  Turtlebot_ActiveWheel::Initialize
            ((this->m_drive_wheels).
             super__Vector_base<std::shared_ptr<chrono::turtlebot::Turtlebot_ActiveWheel>,_std::allocator<std::shared_ptr<chrono::turtlebot::Turtlebot_ActiveWheel>_>_>
             ._M_impl.super__Vector_impl_data._M_start[1].
             super___shared_ptr<chrono::turtlebot::Turtlebot_ActiveWheel,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr);
  Turtlebot_PassiveWheel::Initialize
            ((this->m_passive_wheels).
             super__Vector_base<std::shared_ptr<chrono::turtlebot::Turtlebot_PassiveWheel>,_std::allocator<std::shared_ptr<chrono::turtlebot::Turtlebot_PassiveWheel>_>_>
             ._M_impl.super__Vector_impl_data._M_start[1].
             super___shared_ptr<chrono::turtlebot::Turtlebot_PassiveWheel,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr);
  lVar12 = 0;
  do {
    Turtlebot_Rod_Short::Initialize
              (*(Turtlebot_Rod_Short **)
                ((long)&(((this->m_1st_level_rods).
                          super__Vector_base<std::shared_ptr<chrono::turtlebot::Turtlebot_Rod_Short>,_std::allocator<std::shared_ptr<chrono::turtlebot::Turtlebot_Rod_Short>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super___shared_ptr<chrono::turtlebot::Turtlebot_Rod_Short,_(__gnu_cxx::_Lock_policy)2>
                        )._M_ptr + lVar12));
    Turtlebot_Rod_Short::Initialize
              (*(Turtlebot_Rod_Short **)
                ((long)&(((this->m_2nd_level_rods).
                          super__Vector_base<std::shared_ptr<chrono::turtlebot::Turtlebot_Rod_Short>,_std::allocator<std::shared_ptr<chrono::turtlebot::Turtlebot_Rod_Short>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super___shared_ptr<chrono::turtlebot::Turtlebot_Rod_Short,_(__gnu_cxx::_Lock_policy)2>
                        )._M_ptr + lVar12));
    Turtlebot_Rod_Long::Initialize
              (*(Turtlebot_Rod_Long **)
                ((long)&(((this->m_3rd_level_rods).
                          super__Vector_base<std::shared_ptr<chrono::turtlebot::Turtlebot_Rod_Long>,_std::allocator<std::shared_ptr<chrono::turtlebot::Turtlebot_Rod_Long>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super___shared_ptr<chrono::turtlebot::Turtlebot_Rod_Long,_(__gnu_cxx::_Lock_policy)2>
                        )._M_ptr + lVar12));
    lVar12 = lVar12 + 0x10;
  } while (lVar12 != 0x60);
  const_speed_function_l.super___shared_ptr<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
  const_speed_function_l.super___shared_ptr<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)
           (const_speed_function_l.
            super___shared_ptr<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi + 1);
  (const_speed_function_l.super___shared_ptr<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2>.
   _M_refcount._M_pi)->_M_use_count = 1;
  (const_speed_function_l.super___shared_ptr<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2>.
   _M_refcount._M_pi)->_M_weak_count = 1;
  (const_speed_function_l.super___shared_ptr<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2>.
   _M_refcount._M_pi)->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0017eeb8
  ;
  const_speed_function_l.super___shared_ptr<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi[1]._vptr__Sp_counted_base =
       (_func_int **)chrono::ChClassFactory::GetGlobalClassFactory;
  const_speed_function_l.super___shared_ptr<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi[1]._M_use_count = 0x54442d18;
  const_speed_function_l.super___shared_ptr<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi[1]._M_weak_count = -0x3ff6de05;
  const_speed_function_r.super___shared_ptr<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
  (const_speed_function_r.super___shared_ptr<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2>.
   _M_refcount._M_pi)->_M_use_count = 1;
  (const_speed_function_r.super___shared_ptr<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2>.
   _M_refcount._M_pi)->_M_weak_count = 1;
  const_speed_function_r.super___shared_ptr<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)
           (const_speed_function_r.
            super___shared_ptr<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi + 1);
  (const_speed_function_r.super___shared_ptr<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2>.
   _M_refcount._M_pi)->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0017eeb8
  ;
  const_speed_function_r.super___shared_ptr<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi[1]._vptr__Sp_counted_base =
       (_func_int **)chrono::ChClassFactory::GetGlobalClassFactory;
  const_speed_function_r.super___shared_ptr<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi[1]._M_use_count = 0x54442d18;
  const_speed_function_r.super___shared_ptr<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi[1]._M_weak_count = -0x3ff6de05;
  std::
  vector<std::shared_ptr<chrono::ChFunction_Const>,_std::allocator<std::shared_ptr<chrono::ChFunction_Const>_>_>
  ::push_back(&this->m_motors_func,&const_speed_function_l);
  std::
  vector<std::shared_ptr<chrono::ChFunction_Const>,_std::allocator<std::shared_ptr<chrono::ChFunction_Const>_>_>
  ::push_back(&this->m_motors_func,&const_speed_function_r);
  chrono::Q_from_AngX(1.5707963267948966);
  chrono::Q_from_AngY(-1.5707963267948966);
  peVar1 = (((this->m_drive_wheels).
             super__Vector_base<std::shared_ptr<chrono::turtlebot::Turtlebot_ActiveWheel>,_std::allocator<std::shared_ptr<chrono::turtlebot::Turtlebot_ActiveWheel>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
           super___shared_ptr<chrono::turtlebot::Turtlebot_ActiveWheel,_(__gnu_cxx::_Lock_policy)2>)
           ._M_ptr;
  local_298.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       *(element_type **)
        &((shared_ptr<chrono::ChBodyAuxRef> *)((long)&peVar1->super_Turtlebot_Part + 0x28))->
         super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>;
  local_298.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)&peVar1->super_Turtlebot_Part + 0x30))
       ->_M_pi;
  _Var2._M_pi = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                ((long)&peVar1->super_Turtlebot_Part + 0x30))->_M_pi;
  if (_Var2._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (_Var2._M_pi)->_M_use_count = (_Var2._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (_Var2._M_pi)->_M_use_count = (_Var2._M_pi)->_M_use_count + 1;
    }
  }
  peVar10 = (this->m_chassis).
            super___shared_ptr<chrono::turtlebot::Turtlebot_Chassis,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  local_2a8.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (peVar10->super_Turtlebot_Part).m_body.
       super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_2a8.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (peVar10->super_Turtlebot_Part).m_body.
       super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  p_Var3 = (peVar10->super_Turtlebot_Part).m_body.
           super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      UNLOCK();
      peVar10 = (this->m_chassis).
                super___shared_ptr<chrono::turtlebot::Turtlebot_Chassis,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
    }
    else {
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
    }
  }
  local_2b8.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (peVar10->super_Turtlebot_Part).m_body.
       super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_2b8.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (peVar10->super_Turtlebot_Part).m_body.
       super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  p_Var3 = (peVar10->super_Turtlebot_Part).m_body.
           super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
    }
  }
  local_208 = vmovhps_avx(ZEXT816(0) << 0x20,0x3fbd73eab367a0f9);
  pCVar4 = this->m_system;
  dStack_1f8 = 0.03735;
  local_2c8.super___shared_ptr<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       const_speed_function_l.
       super___shared_ptr<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_2c8.super___shared_ptr<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = const_speed_function_l.
          super___shared_ptr<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  ;
  if (const_speed_function_l.
      super___shared_ptr<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (const_speed_function_l.
       super___shared_ptr<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (const_speed_function_l.
                      super___shared_ptr<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (const_speed_function_l.
       super___shared_ptr<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (const_speed_function_l.
                      super___shared_ptr<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  AddMotor((turtlebot *)&local_178,&local_298,&local_2a8,&local_2b8,pCVar4,
           (ChVector<double> *)local_208,&z2y,&local_2c8);
  std::
  vector<std::shared_ptr<chrono::ChLinkMotorRotationSpeed>,std::allocator<std::shared_ptr<chrono::ChLinkMotorRotationSpeed>>>
  ::emplace_back<std::shared_ptr<chrono::ChLinkMotorRotationSpeed>>
            ((vector<std::shared_ptr<chrono::ChLinkMotorRotationSpeed>,std::allocator<std::shared_ptr<chrono::ChLinkMotorRotationSpeed>>>
              *)&this->m_motors,&local_178);
  if (local_178.super___shared_ptr<chrono::ChLinkMotorRotationSpeed,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_178.
               super___shared_ptr<chrono::ChLinkMotorRotationSpeed,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_2c8.super___shared_ptr<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2c8.super___shared_ptr<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_2b8.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2b8.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_2a8.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2a8.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_298.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_298.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  peVar5 = (((this->m_passive_wheels).
             super__Vector_base<std::shared_ptr<chrono::turtlebot::Turtlebot_PassiveWheel>,_std::allocator<std::shared_ptr<chrono::turtlebot::Turtlebot_PassiveWheel>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
           super___shared_ptr<chrono::turtlebot::Turtlebot_PassiveWheel,_(__gnu_cxx::_Lock_policy)2>
           )._M_ptr;
  local_2d8.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (((shared_ptr<chrono::ChBodyAuxRef> *)((long)&peVar5->super_Turtlebot_Part + 0x28))->
       super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_2d8.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)&peVar5->super_Turtlebot_Part + 0x30))
       ->_M_pi;
  _Var2._M_pi = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                ((long)&peVar5->super_Turtlebot_Part + 0x30))->_M_pi;
  if (_Var2._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (_Var2._M_pi)->_M_use_count = (_Var2._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (_Var2._M_pi)->_M_use_count = (_Var2._M_pi)->_M_use_count + 1;
    }
  }
  peVar10 = (this->m_chassis).
            super___shared_ptr<chrono::turtlebot::Turtlebot_Chassis,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  local_2e8.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (peVar10->super_Turtlebot_Part).m_body.
       super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_2e8.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (peVar10->super_Turtlebot_Part).m_body.
       super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  p_Var3 = (peVar10->super_Turtlebot_Part).m_body.
           super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      UNLOCK();
      peVar10 = (this->m_chassis).
                super___shared_ptr<chrono::turtlebot::Turtlebot_Chassis,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
    }
    else {
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
    }
  }
  local_2f8.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (peVar10->super_Turtlebot_Part).m_body.
       super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_2f8.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (peVar10->super_Turtlebot_Part).m_body.
       super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  p_Var3 = (peVar10->super_Turtlebot_Part).m_body.
           super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
    }
  }
  local_208 = ZEXT816(0x3fbd73eab367a0f9);
  dStack_1f8 = 0.02015;
  AddRevoluteJoint(&local_2d8,&local_2e8,&local_2f8,this->m_system,(ChVector<double> *)local_208,
                   &z2x);
  if (local_2f8.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2f8.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_2e8.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2e8.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_2d8.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2d8.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  peVar1 = (this->m_drive_wheels).
           super__Vector_base<std::shared_ptr<chrono::turtlebot::Turtlebot_ActiveWheel>,_std::allocator<std::shared_ptr<chrono::turtlebot::Turtlebot_ActiveWheel>_>_>
           ._M_impl.super__Vector_impl_data._M_start[1].
           super___shared_ptr<chrono::turtlebot::Turtlebot_ActiveWheel,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  local_308.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       *(element_type **)
        &((shared_ptr<chrono::ChBodyAuxRef> *)((long)&peVar1->super_Turtlebot_Part + 0x28))->
         super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>;
  local_308.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)&peVar1->super_Turtlebot_Part + 0x30))
       ->_M_pi;
  _Var2._M_pi = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                ((long)&peVar1->super_Turtlebot_Part + 0x30))->_M_pi;
  if (_Var2._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (_Var2._M_pi)->_M_use_count = (_Var2._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (_Var2._M_pi)->_M_use_count = (_Var2._M_pi)->_M_use_count + 1;
    }
  }
  peVar10 = (this->m_chassis).
            super___shared_ptr<chrono::turtlebot::Turtlebot_Chassis,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  local_318.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (peVar10->super_Turtlebot_Part).m_body.
       super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_318.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (peVar10->super_Turtlebot_Part).m_body.
       super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  p_Var3 = (peVar10->super_Turtlebot_Part).m_body.
           super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      UNLOCK();
      peVar10 = (this->m_chassis).
                super___shared_ptr<chrono::turtlebot::Turtlebot_Chassis,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
    }
    else {
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
    }
  }
  local_328.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (peVar10->super_Turtlebot_Part).m_body.
       super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_328.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (peVar10->super_Turtlebot_Part).m_body.
       super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  p_Var3 = (peVar10->super_Turtlebot_Part).m_body.
           super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
    }
  }
  local_208 = vmovhps_avx(ZEXT816(0) << 0x20,0xbfbd73eab367a0f9);
  pCVar4 = this->m_system;
  dStack_1f8 = 0.03735;
  local_338.super___shared_ptr<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       const_speed_function_r.
       super___shared_ptr<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_338.super___shared_ptr<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = const_speed_function_r.
          super___shared_ptr<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  ;
  if (const_speed_function_r.
      super___shared_ptr<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (const_speed_function_r.
       super___shared_ptr<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (const_speed_function_r.
                      super___shared_ptr<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (const_speed_function_r.
       super___shared_ptr<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (const_speed_function_r.
                      super___shared_ptr<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  AddMotor((turtlebot *)&local_178,&local_308,&local_318,&local_328,pCVar4,
           (ChVector<double> *)local_208,&z2y,&local_338);
  std::
  vector<std::shared_ptr<chrono::ChLinkMotorRotationSpeed>,std::allocator<std::shared_ptr<chrono::ChLinkMotorRotationSpeed>>>
  ::emplace_back<std::shared_ptr<chrono::ChLinkMotorRotationSpeed>>
            ((vector<std::shared_ptr<chrono::ChLinkMotorRotationSpeed>,std::allocator<std::shared_ptr<chrono::ChLinkMotorRotationSpeed>>>
              *)&this->m_motors,&local_178);
  if (local_178.super___shared_ptr<chrono::ChLinkMotorRotationSpeed,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_178.
               super___shared_ptr<chrono::ChLinkMotorRotationSpeed,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_338.super___shared_ptr<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_338.super___shared_ptr<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_328.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_328.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_318.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_318.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_308.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_308.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  peVar5 = (this->m_passive_wheels).
           super__Vector_base<std::shared_ptr<chrono::turtlebot::Turtlebot_PassiveWheel>,_std::allocator<std::shared_ptr<chrono::turtlebot::Turtlebot_PassiveWheel>_>_>
           ._M_impl.super__Vector_impl_data._M_start[1].
           super___shared_ptr<chrono::turtlebot::Turtlebot_PassiveWheel,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  local_348.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (((shared_ptr<chrono::ChBodyAuxRef> *)((long)&peVar5->super_Turtlebot_Part + 0x28))->
       super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_348.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)&peVar5->super_Turtlebot_Part + 0x30))
       ->_M_pi;
  _Var2._M_pi = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                ((long)&peVar5->super_Turtlebot_Part + 0x30))->_M_pi;
  if (_Var2._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (_Var2._M_pi)->_M_use_count = (_Var2._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (_Var2._M_pi)->_M_use_count = (_Var2._M_pi)->_M_use_count + 1;
    }
  }
  peVar10 = (this->m_chassis).
            super___shared_ptr<chrono::turtlebot::Turtlebot_Chassis,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  local_358.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (peVar10->super_Turtlebot_Part).m_body.
       super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_358.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (peVar10->super_Turtlebot_Part).m_body.
       super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  p_Var3 = (peVar10->super_Turtlebot_Part).m_body.
           super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      UNLOCK();
      peVar10 = (this->m_chassis).
                super___shared_ptr<chrono::turtlebot::Turtlebot_Chassis,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
    }
    else {
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
    }
  }
  local_368.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (peVar10->super_Turtlebot_Part).m_body.
       super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_368.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (peVar10->super_Turtlebot_Part).m_body.
       super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  p_Var3 = (peVar10->super_Turtlebot_Part).m_body.
           super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
    }
  }
  rel_joint_pos = (ChVector<double> *)local_208;
  local_208 = ZEXT816(0xbfbd73eab367a0f9);
  dStack_1f8 = 0.02015;
  AddRevoluteJoint(&local_348,&local_358,&local_368,this->m_system,rel_joint_pos,&z2x);
  if (local_368.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_368.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_358.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_358.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_348.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_348.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  pdVar11 = adStack_168;
  rel_joint_pos_00 = &local_c8;
  lVar12 = 0;
  local_208._8_8_ = 0x3fbeb313be22e5de;
  local_208._0_8_ = 0xbfaced916872b021;
  dStack_1f8 = 0.09615;
  uStack_1f0 = 0x3fab645a1cac0831;
  uStack_1e8 = 0x3fbeb313be22e5de;
  uStack_1e0 = 0x3fb89d495182a993;
  uStack_1d8 = 0x3fbe5604189374bc;
  uStack_1d0 = 0x3fb4f8b588e368f1;
  local_1c8 = 0x3fb89d495182a993;
  uStack_1c0 = 0x3fbe5604189374bc;
  uStack_1b8 = 0xbfb4f8b588e368f1;
  uStack_1b0 = 0x3fb89d495182a993;
  uStack_1a8 = 0x3fab645a1cac0831;
  uStack_1a0 = 0xbfbeb313be22e5de;
  uStack_198 = 0x3fb89d495182a993;
  uStack_190 = 0xbfaced916872b021;
  local_178.super___shared_ptr<chrono::ChLinkMotorRotationSpeed,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0xbfba9bcfd4bf0996;
  local_178.super___shared_ptr<chrono::ChLinkMotorRotationSpeed,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x3fb91148fd9fd36f;
  adStack_168[0] = 0.15015;
  adStack_168[1] = -0.0015;
  adStack_168[2] = 0.16192;
  adStack_168[3] = 0.15015;
  adStack_168[4] = 0.0687;
  adStack_168[5] = 0.13132;
  local_188 = 0xbfbeb313be22e5de;
  uStack_180 = 0x3fb89d495182a993;
  adStack_168[6] = 0.15015;
  adStack_168[7] = 0.0687;
  adStack_168[8] = -0.13132;
  adStack_168[9] = 0.15015;
  adStack_168[10] = -0.0015;
  adStack_168[0xb] = -0.16192;
  adStack_168[0xc] = 0.15015;
  adStack_168[0xd] = -0.10394;
  local_c8.m_data[0] = -0.10394;
  local_c8.m_data[1] = 0.09792;
  local_c8.m_data[2] = 0.20615;
  uStack_b0 = 0xbf589374bc6a7efa;
  uStack_a8 = 0x3fc4b9cb6848beb6;
  uStack_a0 = 0x3fca631f8a0902de;
  uStack_98 = 0x3fb19652bd3c3611;
  uStack_90 = 0x3fc0cf1800a7c5ac;
  adStack_168[0xe] = -0.09792;
  adStack_168[0xf] = 0.15015;
  local_88 = 0x3fca631f8a0902de;
  uStack_80 = 0x3fb19652bd3c3611;
  uStack_78 = 0xbfc0cf1800a7c5ac;
  uStack_70 = 0x3fca631f8a0902de;
  uStack_68 = 0xbf589374bc6a7efa;
  uStack_60 = 0xbfc4b9cb6848beb6;
  uStack_58 = 0x3fca631f8a0902de;
  uStack_50 = 0xbfba9bcfd4bf0996;
  local_48 = 0xbfb91148fd9fd36f;
  uStack_40 = 0x3fca631f8a0902de;
  do {
    v.m_data[0] = rel_joint_pos->m_data[0] + 0.0;
    v.m_data[1] = rel_joint_pos->m_data[1] + 0.0;
    v.m_data[2] = rel_joint_pos->m_data[2] + 0.05;
    v_1.m_data[0] = pdVar11[-2] + 0.0;
    v_1.m_data[1] = pdVar11[-1] + 0.0;
    v_1.m_data[2] = *pdVar11 + 0.05;
    v_2.m_data[0] = rel_joint_pos_00->m_data[0] + 0.0;
    v_2.m_data[1] = rel_joint_pos_00->m_data[1] + 0.0;
    v_2.m_data[2] = rel_joint_pos_00->m_data[2] + 0.2;
    lVar6 = *(long *)((long)&(((this->m_1st_level_rods).
                               super__Vector_base<std::shared_ptr<chrono::turtlebot::Turtlebot_Rod_Short>,_std::allocator<std::shared_ptr<chrono::turtlebot::Turtlebot_Rod_Short>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super___shared_ptr<chrono::turtlebot::Turtlebot_Rod_Short,_(__gnu_cxx::_Lock_policy)2>
                             )._M_ptr + lVar12);
    local_378.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         *(element_type **)(lVar6 + 0x28);
    local_378.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar6 + 0x30);
    lVar6 = *(long *)(lVar6 + 0x30);
    if (lVar6 != 0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)(lVar6 + 8) = *(int *)(lVar6 + 8) + 1;
        UNLOCK();
      }
      else {
        *(int *)(lVar6 + 8) = *(int *)(lVar6 + 8) + 1;
      }
    }
    peVar10 = (this->m_chassis).
              super___shared_ptr<chrono::turtlebot::Turtlebot_Chassis,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
    local_388.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (peVar10->super_Turtlebot_Part).m_body.
         super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_388.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (peVar10->super_Turtlebot_Part).m_body.
           super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    p_Var3 = (peVar10->super_Turtlebot_Part).m_body.
             super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
        UNLOCK();
        peVar10 = (this->m_chassis).
                  super___shared_ptr<chrono::turtlebot::Turtlebot_Chassis,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr;
      }
      else {
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      }
    }
    local_398.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (peVar10->super_Turtlebot_Part).m_body.
         super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_398.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (peVar10->super_Turtlebot_Part).m_body.
           super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    p_Var3 = (peVar10->super_Turtlebot_Part).m_body.
             super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      }
    }
    local_4a8._8_16_ = ZEXT816(0) << 0x20;
    local_4a8._0_8_ = 1.0;
    local_490 = 0.0;
    AddLockJoint(&local_378,&local_388,&local_398,this->m_system,rel_joint_pos,
                 (ChQuaternion<double> *)local_4a8);
    if (local_398.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_398.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_388.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_388.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_378.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_378.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    lVar6 = *(long *)((long)&(((this->m_1st_level_rods).
                               super__Vector_base<std::shared_ptr<chrono::turtlebot::Turtlebot_Rod_Short>,_std::allocator<std::shared_ptr<chrono::turtlebot::Turtlebot_Rod_Short>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super___shared_ptr<chrono::turtlebot::Turtlebot_Rod_Short,_(__gnu_cxx::_Lock_policy)2>
                             )._M_ptr + lVar12);
    local_3a8.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         *(element_type **)(lVar6 + 0x28);
    local_3a8.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar6 + 0x30);
    lVar6 = *(long *)(lVar6 + 0x30);
    if (lVar6 != 0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)(lVar6 + 8) = *(int *)(lVar6 + 8) + 1;
        UNLOCK();
      }
      else {
        *(int *)(lVar6 + 8) = *(int *)(lVar6 + 8) + 1;
      }
    }
    peVar7 = (this->m_bottom_plate).
             super___shared_ptr<chrono::turtlebot::Turtlebot_BottomPlate,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    local_3b8.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (peVar7->super_Turtlebot_Part).m_body.
         super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_3b8.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (peVar7->super_Turtlebot_Part).m_body.
           super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    p_Var3 = (peVar7->super_Turtlebot_Part).m_body.
             super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      }
    }
    peVar10 = (this->m_chassis).
              super___shared_ptr<chrono::turtlebot::Turtlebot_Chassis,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
    local_3c8.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (peVar10->super_Turtlebot_Part).m_body.
         super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_3c8.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (peVar10->super_Turtlebot_Part).m_body.
           super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    p_Var3 = (peVar10->super_Turtlebot_Part).m_body.
             super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      }
    }
    local_4a8._8_16_ = ZEXT816(0) << 0x20;
    local_4a8._0_8_ = 1.0;
    local_490 = 0.0;
    AddLockJoint(&local_3a8,&local_3b8,&local_3c8,this->m_system,&v,
                 (ChQuaternion<double> *)local_4a8);
    if (local_3c8.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_3c8.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_3b8.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_3b8.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_3a8.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_3a8.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    lVar6 = *(long *)((long)&(((this->m_2nd_level_rods).
                               super__Vector_base<std::shared_ptr<chrono::turtlebot::Turtlebot_Rod_Short>,_std::allocator<std::shared_ptr<chrono::turtlebot::Turtlebot_Rod_Short>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super___shared_ptr<chrono::turtlebot::Turtlebot_Rod_Short,_(__gnu_cxx::_Lock_policy)2>
                             )._M_ptr + lVar12);
    local_3d8.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         *(element_type **)(lVar6 + 0x28);
    local_3d8.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar6 + 0x30);
    lVar6 = *(long *)(lVar6 + 0x30);
    if (lVar6 != 0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)(lVar6 + 8) = *(int *)(lVar6 + 8) + 1;
        UNLOCK();
      }
      else {
        *(int *)(lVar6 + 8) = *(int *)(lVar6 + 8) + 1;
      }
    }
    peVar7 = (this->m_bottom_plate).
             super___shared_ptr<chrono::turtlebot::Turtlebot_BottomPlate,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    local_3e8.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (peVar7->super_Turtlebot_Part).m_body.
         super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_3e8.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (peVar7->super_Turtlebot_Part).m_body.
           super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    p_Var3 = (peVar7->super_Turtlebot_Part).m_body.
             super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      }
    }
    peVar10 = (this->m_chassis).
              super___shared_ptr<chrono::turtlebot::Turtlebot_Chassis,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
    local_3f8.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (peVar10->super_Turtlebot_Part).m_body.
         super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_3f8.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (peVar10->super_Turtlebot_Part).m_body.
           super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    p_Var3 = (peVar10->super_Turtlebot_Part).m_body.
             super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      }
    }
    local_4a8._8_16_ = ZEXT816(0) << 0x20;
    local_4a8._0_8_ = 1.0;
    local_490 = 0.0;
    AddLockJoint(&local_3d8,&local_3e8,&local_3f8,this->m_system,rel_joint_pos,
                 (ChQuaternion<double> *)local_4a8);
    if (local_3f8.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_3f8.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_3e8.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_3e8.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_3d8.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_3d8.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    lVar6 = *(long *)((long)&(((this->m_2nd_level_rods).
                               super__Vector_base<std::shared_ptr<chrono::turtlebot::Turtlebot_Rod_Short>,_std::allocator<std::shared_ptr<chrono::turtlebot::Turtlebot_Rod_Short>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super___shared_ptr<chrono::turtlebot::Turtlebot_Rod_Short,_(__gnu_cxx::_Lock_policy)2>
                             )._M_ptr + lVar12);
    local_408.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         *(element_type **)(lVar6 + 0x28);
    local_408.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar6 + 0x30);
    lVar6 = *(long *)(lVar6 + 0x30);
    if (lVar6 != 0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)(lVar6 + 8) = *(int *)(lVar6 + 8) + 1;
        UNLOCK();
      }
      else {
        *(int *)(lVar6 + 8) = *(int *)(lVar6 + 8) + 1;
      }
    }
    peVar8 = (this->m_middle_plate).
             super___shared_ptr<chrono::turtlebot::Turtlebot_MiddlePlate,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    local_418.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (peVar8->super_Turtlebot_Part).m_body.
         super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_418.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (peVar8->super_Turtlebot_Part).m_body.
           super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    p_Var3 = (peVar8->super_Turtlebot_Part).m_body.
             super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      }
    }
    peVar10 = (this->m_chassis).
              super___shared_ptr<chrono::turtlebot::Turtlebot_Chassis,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
    local_428.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (peVar10->super_Turtlebot_Part).m_body.
         super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_428.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (peVar10->super_Turtlebot_Part).m_body.
           super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    p_Var3 = (peVar10->super_Turtlebot_Part).m_body.
             super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      }
    }
    local_4a8._8_16_ = ZEXT816(0) << 0x20;
    local_4a8._0_8_ = 1.0;
    local_490 = 0.0;
    AddLockJoint(&local_408,&local_418,&local_428,this->m_system,&v_1,
                 (ChQuaternion<double> *)local_4a8);
    if (local_428.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_428.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_418.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_418.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_408.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_408.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    lVar6 = *(long *)((long)&(((this->m_3rd_level_rods).
                               super__Vector_base<std::shared_ptr<chrono::turtlebot::Turtlebot_Rod_Long>,_std::allocator<std::shared_ptr<chrono::turtlebot::Turtlebot_Rod_Long>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super___shared_ptr<chrono::turtlebot::Turtlebot_Rod_Long,_(__gnu_cxx::_Lock_policy)2>
                             )._M_ptr + lVar12);
    local_438.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         *(element_type **)(lVar6 + 0x28);
    local_438.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar6 + 0x30);
    lVar6 = *(long *)(lVar6 + 0x30);
    if (lVar6 != 0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)(lVar6 + 8) = *(int *)(lVar6 + 8) + 1;
        UNLOCK();
      }
      else {
        *(int *)(lVar6 + 8) = *(int *)(lVar6 + 8) + 1;
      }
    }
    peVar8 = (this->m_middle_plate).
             super___shared_ptr<chrono::turtlebot::Turtlebot_MiddlePlate,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    local_448.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (peVar8->super_Turtlebot_Part).m_body.
         super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_448.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (peVar8->super_Turtlebot_Part).m_body.
           super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    p_Var3 = (peVar8->super_Turtlebot_Part).m_body.
             super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      }
    }
    peVar10 = (this->m_chassis).
              super___shared_ptr<chrono::turtlebot::Turtlebot_Chassis,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
    local_458.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (peVar10->super_Turtlebot_Part).m_body.
         super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_458.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (peVar10->super_Turtlebot_Part).m_body.
           super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    p_Var3 = (peVar10->super_Turtlebot_Part).m_body.
             super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      }
    }
    local_4a8._8_16_ = ZEXT816(0) << 0x20;
    local_4a8._0_8_ = 1.0;
    local_490 = 0.0;
    AddLockJoint(&local_438,&local_448,&local_458,this->m_system,rel_joint_pos_00,
                 (ChQuaternion<double> *)local_4a8);
    if (local_458.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_458.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_448.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_448.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_438.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_438.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    lVar6 = *(long *)((long)&(((this->m_3rd_level_rods).
                               super__Vector_base<std::shared_ptr<chrono::turtlebot::Turtlebot_Rod_Long>,_std::allocator<std::shared_ptr<chrono::turtlebot::Turtlebot_Rod_Long>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super___shared_ptr<chrono::turtlebot::Turtlebot_Rod_Long,_(__gnu_cxx::_Lock_policy)2>
                             )._M_ptr + lVar12);
    local_468.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         *(element_type **)(lVar6 + 0x28);
    local_468.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar6 + 0x30);
    lVar6 = *(long *)(lVar6 + 0x30);
    if (lVar6 != 0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)(lVar6 + 8) = *(int *)(lVar6 + 8) + 1;
        UNLOCK();
      }
      else {
        *(int *)(lVar6 + 8) = *(int *)(lVar6 + 8) + 1;
      }
    }
    peVar9 = (this->m_top_plate).
             super___shared_ptr<chrono::turtlebot::Turtlebot_TopPlate,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    local_478.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (peVar9->super_Turtlebot_Part).m_body.
         super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_478.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (peVar9->super_Turtlebot_Part).m_body.
           super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    p_Var3 = (peVar9->super_Turtlebot_Part).m_body.
             super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      }
    }
    peVar10 = (this->m_chassis).
              super___shared_ptr<chrono::turtlebot::Turtlebot_Chassis,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
    local_488.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (peVar10->super_Turtlebot_Part).m_body.
         super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_488.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (peVar10->super_Turtlebot_Part).m_body.
           super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    p_Var3 = (peVar10->super_Turtlebot_Part).m_body.
             super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      }
    }
    local_4a8._8_16_ = ZEXT816(0) << 0x20;
    local_4a8._0_8_ = 1.0;
    local_490 = 0.0;
    AddLockJoint(&local_468,&local_478,&local_488,this->m_system,&v_2,
                 (ChQuaternion<double> *)local_4a8);
    if (local_488.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_488.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_478.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_478.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_468.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_468.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    rel_joint_pos_00 = rel_joint_pos_00 + 1;
    pdVar11 = pdVar11 + 3;
    rel_joint_pos = rel_joint_pos + 1;
    lVar12 = lVar12 + 0x10;
  } while (lVar12 != 0x60);
  if (const_speed_function_r.
      super___shared_ptr<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (const_speed_function_r.
               super___shared_ptr<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (const_speed_function_l.
      super___shared_ptr<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (const_speed_function_l.
               super___shared_ptr<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  return;
}

Assistant:

void TurtleBot::Initialize() {
    m_chassis->Initialize();
    m_bottom_plate->Initialize();
    m_middle_plate->Initialize();
    m_top_plate->Initialize();
    for (int i = 0; i < 2; i++) {
        m_drive_wheels[i]->Initialize();
        m_passive_wheels[i]->Initialize();
    }

    for (int i = 0; i < 6; i++) {
        m_1st_level_rods[i]->Initialize();
        m_2nd_level_rods[i]->Initialize();
        m_3rd_level_rods[i]->Initialize();
    }

    // redeclare necessary location variables
    double dwx = 0;
    double dwy = 0.11505;
    double dwz = 0.03735;

    double pwx = 0.11505;
    double pwy = 0;
    double pwz = 0.02015;

    double rod_s_0_x = -0.0565;
    double rod_s_0_y = 0.11992;
    double rod_s_0_z = 0.09615;

    double rod_s_1_x = 0.0535;
    double rod_s_1_y = 0.11992;
    double rod_s_1_z = 0.09615;

    double rod_s_2_x = 0.11850;
    double rod_s_2_y = 0.08192;
    double rod_s_2_z = 0.09615;

    double rod_s_3_x = 0.11850;
    double rod_s_3_y = -0.08192;
    double rod_s_3_z = 0.09615;

    double rod_s_4_x = 0.0535;
    double rod_s_4_y = -0.11992;
    double rod_s_4_z = 0.09615;

    double rod_s_5_x = -0.0565;
    double rod_s_5_y = -0.11992;
    double rod_s_5_z = 0.09615;

    double rod_m_0_x = -0.10394;
    double rod_m_0_y = 0.09792;
    double rod_m_0_z = 0.15015;

    double rod_m_1_x = -0.0015;
    double rod_m_1_y = 0.16192;
    double rod_m_1_z = 0.15015;

    double rod_m_2_x = 0.0687;
    double rod_m_2_y = 0.13132;
    double rod_m_2_z = 0.15015;

    double rod_m_3_x = 0.0687;
    double rod_m_3_y = -0.13132;
    double rod_m_3_z = 0.15015;

    double rod_m_4_x = -0.0015;
    double rod_m_4_y = -0.16192;
    double rod_m_4_z = 0.15015;

    double rod_m_5_x = -0.10394;
    double rod_m_5_y = -0.09792;
    double rod_m_5_z = 0.15015;

    double rod_u_0_x = -0.10394;
    double rod_u_0_y = 0.09792;
    double rod_u_0_z = 0.20615;

    double rod_u_1_x = -0.0015;
    double rod_u_1_y = 0.16192;
    double rod_u_1_z = 0.20615;

    double rod_u_2_x = 0.0687;
    double rod_u_2_y = 0.13132;
    double rod_u_2_z = 0.20615;

    double rod_u_3_x = 0.0687;
    double rod_u_3_y = -0.13132;
    double rod_u_3_z = 0.20615;

    double rod_u_4_x = -0.0015;
    double rod_u_4_y = -0.16192;
    double rod_u_4_z = 0.20615;

    double rod_u_5_x = -0.10394;
    double rod_u_5_y = -0.09792;
    double rod_u_5_z = 0.20615;

    // add motors and revolute joints on the active and passive wheels
    auto const_speed_function_l = chrono_types::make_shared<ChFunction_Const>(-CH_C_PI);
    auto const_speed_function_r = chrono_types::make_shared<ChFunction_Const>(-CH_C_PI);
    m_motors_func.push_back(const_speed_function_l);
    m_motors_func.push_back(const_speed_function_r);

    ChQuaternion<> z2y = Q_from_AngX(CH_C_PI_2);
    ChQuaternion<> z2x = Q_from_AngY(-CH_C_PI_2);

    m_motors.push_back(AddMotor(m_drive_wheels[0]->GetBody(), m_chassis->GetBody(), m_chassis->GetBody(), m_system,
                                ChVector<>(dwx, dwy, dwz), z2y, const_speed_function_l));
    AddRevoluteJoint(m_passive_wheels[0]->GetBody(), m_chassis->GetBody(), m_chassis->GetBody(), m_system,
                     ChVector<>(pwx, pwy, pwz), z2x);

    m_motors.push_back(AddMotor(m_drive_wheels[1]->GetBody(), m_chassis->GetBody(), m_chassis->GetBody(), m_system,
                                ChVector<>(dwx, -dwy, dwz), z2y, const_speed_function_r));
    AddRevoluteJoint(m_passive_wheels[1]->GetBody(), m_chassis->GetBody(), m_chassis->GetBody(), m_system,
                     ChVector<>(-pwx, pwy, pwz), z2x);

    // add fixity on all rods and plates
    // There are six constraints needed:
    // chassis -> bottom rods
    // bottom rods -> bottom plate
    // bottom plate -> middle rods
    // middle rods -> middle plate
    // middle plate -> top rods
    // top rods -> top plate

    ChVector<> bottom_rod_rel_pos[] = {ChVector<>(rod_s_0_x, rod_s_0_y, rod_s_0_z),  //
                                       ChVector<>(rod_s_1_x, rod_s_1_y, rod_s_1_z),  //
                                       ChVector<>(rod_s_2_x, rod_s_2_y, rod_s_2_z),  //
                                       ChVector<>(rod_s_3_x, rod_s_3_y, rod_s_3_z),  //
                                       ChVector<>(rod_s_4_x, rod_s_4_y, rod_s_4_z),  //
                                       ChVector<>(rod_s_5_x, rod_s_5_y, rod_s_5_z)};
    ChVector<> middle_rod_rel_pos[] = {ChVector<>(rod_m_0_x, rod_m_0_y, rod_m_0_z),  //
                                       ChVector<>(rod_m_1_x, rod_m_1_y, rod_m_1_z),  //
                                       ChVector<>(rod_m_2_x, rod_m_2_y, rod_m_2_z),  //
                                       ChVector<>(rod_m_3_x, rod_m_3_y, rod_m_3_z),  //
                                       ChVector<>(rod_m_4_x, rod_m_4_y, rod_m_4_z),  //
                                       ChVector<>(rod_m_5_x, rod_m_5_y, rod_m_5_z)};
    ChVector<> top_rod_rel_pos[] = {ChVector<>(rod_u_0_x, rod_u_0_y, rod_u_0_z),  //
                                    ChVector<>(rod_u_1_x, rod_u_1_y, rod_u_1_z),  //
                                    ChVector<>(rod_u_2_x, rod_u_2_y, rod_u_2_z),  //
                                    ChVector<>(rod_u_3_x, rod_u_3_y, rod_u_3_z),  //
                                    ChVector<>(rod_u_4_x, rod_u_4_y, rod_u_4_z),  //
                                    ChVector<>(rod_u_5_x, rod_u_5_y, rod_u_5_z)};

    for (int i = 0; i < 6; i++) {
        ChVector<> bottom_plate_rel_pos = bottom_rod_rel_pos[i] + ChVector<>(0, 0, 0.05);
        ChVector<> middle_plate_rel_pos = middle_rod_rel_pos[i] + ChVector<>(0, 0, 0.05);
        ChVector<> top_plate_rel_pos = top_rod_rel_pos[i] + ChVector<>(0, 0, 0.2);

        AddLockJoint(m_1st_level_rods[i]->GetBody(), m_chassis->GetBody(), m_chassis->GetBody(), m_system,
                     bottom_rod_rel_pos[i], ChQuaternion<>(1, 0, 0, 0));
        AddLockJoint(m_1st_level_rods[i]->GetBody(), m_bottom_plate->GetBody(), m_chassis->GetBody(), m_system,
                     bottom_plate_rel_pos, ChQuaternion<>(1, 0, 0, 0));
        AddLockJoint(m_2nd_level_rods[i]->GetBody(), m_bottom_plate->GetBody(), m_chassis->GetBody(), m_system,
                     bottom_rod_rel_pos[i], ChQuaternion<>(1, 0, 0, 0));
        AddLockJoint(m_2nd_level_rods[i]->GetBody(), m_middle_plate->GetBody(), m_chassis->GetBody(), m_system,
                     middle_plate_rel_pos, ChQuaternion<>(1, 0, 0, 0));
        AddLockJoint(m_3rd_level_rods[i]->GetBody(), m_middle_plate->GetBody(), m_chassis->GetBody(), m_system,
                     top_rod_rel_pos[i], ChQuaternion<>(1, 0, 0, 0));
        AddLockJoint(m_3rd_level_rods[i]->GetBody(), m_top_plate->GetBody(), m_chassis->GetBody(), m_system,
                     top_plate_rel_pos, ChQuaternion<>(1, 0, 0, 0));
    }
}